

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCmpa<(moira::Instr)38,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  An dst;
  Ea<(moira::Mode)5,_(moira::Size)2> src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  An in_stack_ffffffffffffffcc;
  Moira *in_stack_ffffffffffffffd0;
  Ea<(moira::Mode)5,_(moira::Size)2> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  
  Op<(moira::Mode)5,(moira::Size)2>
            (in_stack_ffffffffffffffd0,(u16)((uint)in_stack_ffffffffffffffcc.raw >> 0x10),
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  An::An((An *)&stack0xffffffffffffffcc,(int)(uint)in_CX >> 9 & 7);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<
                     ((StrWriter *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  pSVar1 = StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void
Moira::dasmCmpa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = An       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}